

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O1

Totals * __thiscall
Catch::RunContext::runTest(Totals *__return_storage_ptr__,RunContext *this,TestCase *testCase)

{
  Counts *pCVar1;
  size_t *psVar2;
  IStreamingReporter *pIVar3;
  pointer pcVar4;
  ulong uVar5;
  size_t sVar6;
  int iVar7;
  SectionTracker *pSVar8;
  undefined4 extraout_var;
  undefined1 local_1f8 [40];
  _Alloc_hider _Stack_1d0;
  undefined1 auStack_c8 [8];
  Totals prevTotals;
  undefined1 local_70 [8];
  string redirectedCout;
  string redirectedCerr;
  
  prevTotals.testCases.failed = (this->m_totals).testCases.failedButOk;
  auStack_c8._0_4_ = (this->m_totals).error;
  auStack_c8._4_4_ = *(undefined4 *)&(this->m_totals).field_0x4;
  prevTotals.error = (int)(this->m_totals).assertions.passed;
  prevTotals._4_4_ = *(undefined4 *)((long)&(this->m_totals).assertions.passed + 4);
  prevTotals.assertions.passed._0_4_ = (undefined4)(this->m_totals).assertions.failed;
  prevTotals.assertions.passed._4_4_ =
       *(undefined4 *)((long)&(this->m_totals).assertions.failed + 4);
  prevTotals.assertions.failed._0_4_ = (undefined4)(this->m_totals).assertions.failedButOk;
  prevTotals.assertions.failed._4_4_ =
       *(undefined4 *)((long)&(this->m_totals).assertions.failedButOk + 4);
  prevTotals.assertions.failedButOk._0_4_ = (undefined4)(this->m_totals).testCases.passed;
  prevTotals.assertions.failedButOk._4_4_ =
       *(undefined4 *)((long)&(this->m_totals).testCases.passed + 4);
  prevTotals.testCases.passed._0_4_ = (undefined4)(this->m_totals).testCases.failed;
  prevTotals.testCases.passed._4_4_ = *(undefined4 *)((long)&(this->m_totals).testCases.failed + 4);
  local_70 = (undefined1  [8])&redirectedCout._M_string_length;
  redirectedCout._M_dataplus._M_p = (pointer)0x0;
  redirectedCout._M_string_length._0_1_ = 0;
  redirectedCout.field_2._8_8_ = &redirectedCerr._M_string_length;
  redirectedCerr._M_dataplus._M_p = (pointer)0x0;
  redirectedCerr._M_string_length._0_1_ = 0;
  pIVar3 = (this->m_reporter)._M_t.
           super___uniq_ptr_impl<Catch::IStreamingReporter,_std::default_delete<Catch::IStreamingReporter>_>
           ._M_t.
           super__Tuple_impl<0UL,_Catch::IStreamingReporter_*,_std::default_delete<Catch::IStreamingReporter>_>
           .super__Head_base<0UL,_Catch::IStreamingReporter_*,_false>._M_head_impl;
  (*pIVar3->_vptr_IStreamingReporter[7])(pIVar3,testCase);
  this->m_activeTestCase = testCase;
  prevTotals.testCases.failedButOk = (size_t)&this->m_trackerContext;
  pSVar8 = (SectionTracker *)
           TestCaseTracking::TrackerContext::startRun
                     ((TrackerContext *)prevTotals.testCases.failedButOk);
  iVar7 = (*(((this->m_config).super___shared_ptr<const_Catch::IConfig,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr)->super_NonCopyable)._vptr_NonCopyable[0x13])();
  TestCaseTracking::SectionTracker::addInitialFilters
            (pSVar8,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)CONCAT44(extraout_var,iVar7));
  do {
    (this->m_trackerContext).m_currentTracker =
         (this->m_trackerContext).m_rootTracker.
         super___shared_ptr<Catch::TestCaseTracking::ITracker,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    (this->m_trackerContext).m_runState = Executing;
    pcVar4 = (testCase->super_TestCaseInfo).name._M_dataplus._M_p;
    local_1f8._0_8_ = local_1f8 + 0x10;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_1f8,pcVar4,
               pcVar4 + (testCase->super_TestCaseInfo).name._M_string_length);
    local_1f8._32_8_ = (testCase->super_TestCaseInfo).lineInfo.file;
    _Stack_1d0._M_p = (pointer)(testCase->super_TestCaseInfo).lineInfo.line;
    pSVar8 = TestCaseTracking::SectionTracker::acquire
                       ((TrackerContext *)prevTotals.testCases.failedButOk,
                        (NameAndLocation *)local_1f8);
    this->m_testCaseTracker = (ITracker *)pSVar8;
    if ((undefined1 *)local_1f8._0_8_ != local_1f8 + 0x10) {
      operator_delete((void *)local_1f8._0_8_,local_1f8._16_8_ + 1);
    }
    runCurrentTest(this,(string *)local_70,(string *)((long)&redirectedCout.field_2 + 8));
    iVar7 = (*this->m_testCaseTracker->_vptr_ITracker[3])();
    if ((char)iVar7 != '\0') break;
    uVar5 = (this->m_totals).assertions.failed;
    iVar7 = (*(((this->m_config).
                super___shared_ptr<const_Catch::IConfig,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
              super_NonCopyable)._vptr_NonCopyable[9])();
  } while (uVar5 < (ulong)(long)iVar7);
  Totals::delta(__return_storage_ptr__,&this->m_totals,(Totals *)auStack_c8);
  sVar6 = (__return_storage_ptr__->testCases).passed;
  if ((sVar6 != 0 & (byte)(char)(testCase->super_TestCaseInfo).properties >> 2) == 1) {
    psVar2 = &(__return_storage_ptr__->assertions).failed;
    *psVar2 = *psVar2 + 1;
    (__return_storage_ptr__->testCases).passed = sVar6 - 1;
    psVar2 = &(__return_storage_ptr__->testCases).failed;
    *psVar2 = *psVar2 + 1;
  }
  pCVar1 = &(this->m_totals).testCases;
  pCVar1->passed = pCVar1->passed + (__return_storage_ptr__->testCases).passed;
  psVar2 = &(this->m_totals).testCases.failed;
  *psVar2 = *psVar2 + (__return_storage_ptr__->testCases).failed;
  psVar2 = &(this->m_totals).testCases.failedButOk;
  *psVar2 = *psVar2 + (__return_storage_ptr__->testCases).failedButOk;
  pIVar3 = (this->m_reporter)._M_t.
           super___uniq_ptr_impl<Catch::IStreamingReporter,_std::default_delete<Catch::IStreamingReporter>_>
           ._M_t.
           super__Tuple_impl<0UL,_Catch::IStreamingReporter_*,_std::default_delete<Catch::IStreamingReporter>_>
           .super__Head_base<0UL,_Catch::IStreamingReporter_*,_false>._M_head_impl;
  uVar5 = (this->m_totals).assertions.failed;
  iVar7 = (*(((this->m_config).super___shared_ptr<const_Catch::IConfig,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr)->super_NonCopyable)._vptr_NonCopyable[9])();
  TestCaseStats::TestCaseStats
            ((TestCaseStats *)local_1f8,&testCase->super_TestCaseInfo,__return_storage_ptr__,
             (string *)local_70,(string *)((long)&redirectedCout.field_2 + 8),
             (ulong)(long)iVar7 <= uVar5);
  (*pIVar3->_vptr_IStreamingReporter[0xc])(pIVar3,local_1f8);
  TestCaseStats::~TestCaseStats((TestCaseStats *)local_1f8);
  this->m_activeTestCase = (TestCase *)0x0;
  this->m_testCaseTracker = (ITracker *)0x0;
  if ((size_type *)redirectedCout.field_2._8_8_ != &redirectedCerr._M_string_length) {
    operator_delete((void *)redirectedCout.field_2._8_8_,
                    CONCAT71(redirectedCerr._M_string_length._1_7_,
                             (undefined1)redirectedCerr._M_string_length) + 1);
  }
  if (local_70 != (undefined1  [8])&redirectedCout._M_string_length) {
    operator_delete((void *)local_70,
                    CONCAT71(redirectedCout._M_string_length._1_7_,
                             (undefined1)redirectedCout._M_string_length) + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

Totals RunContext::runTest(TestCase const& testCase) {
        Totals prevTotals = m_totals;

        std::string redirectedCout;
        std::string redirectedCerr;

        auto const& testInfo = testCase.getTestCaseInfo();

        m_reporter->testCaseStarting(testInfo);

        m_activeTestCase = &testCase;

        ITracker& rootTracker = m_trackerContext.startRun();
        assert(rootTracker.isSectionTracker());
        static_cast<SectionTracker&>(rootTracker).addInitialFilters(m_config->getSectionsToRun());
        do {
            m_trackerContext.startCycle();
            m_testCaseTracker = &SectionTracker::acquire(m_trackerContext, TestCaseTracking::NameAndLocation(testInfo.name, testInfo.lineInfo));
            runCurrentTest(redirectedCout, redirectedCerr);
        } while (!m_testCaseTracker->isSuccessfullyCompleted() && !aborting());

        Totals deltaTotals = m_totals.delta(prevTotals);
        if (testInfo.expectedToFail() && deltaTotals.testCases.passed > 0) {
            deltaTotals.assertions.failed++;
            deltaTotals.testCases.passed--;
            deltaTotals.testCases.failed++;
        }
        m_totals.testCases += deltaTotals.testCases;
        m_reporter->testCaseEnded(TestCaseStats(testInfo,
            deltaTotals,
            redirectedCout,
            redirectedCerr,
            aborting()));

        m_activeTestCase = nullptr;
        m_testCaseTracker = nullptr;

        return deltaTotals;
    }